

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O3

bool llvm::consumeUnsignedInteger(StringRef *Str,uint Radix,unsigned_long_long *Result)

{
  byte bVar1;
  short *psVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  byte *pbVar10;
  ulong uVar11;
  
  uVar9 = Str->Length;
  if (Radix == 0) {
    uVar7 = 10;
    Radix = 10;
    if (1 < uVar9) {
      psVar2 = (short *)Str->Data;
      if ((*psVar2 == 0x7830) || (*psVar2 == 0x5830)) {
        Radix = 0x10;
LAB_00da1f8d:
        psVar2 = psVar2 + 1;
        lVar5 = -2;
      }
      else {
        if ((*psVar2 == 0x6230) || (*psVar2 == 0x4230)) {
          Radix = 2;
          goto LAB_00da1f8d;
        }
        if (*psVar2 == 0x6f30) {
          Radix = 8;
          goto LAB_00da1f8d;
        }
        if (((char)*psVar2 != '0') || (9 < (byte)(*(char *)((long)psVar2 + 1) - 0x30U)))
        goto LAB_00da1fa7;
        psVar2 = (short *)((long)psVar2 + 1);
        Radix = 8;
        lVar5 = -1;
      }
      uVar9 = uVar9 + lVar5;
      Str->Data = (char *)psVar2;
      Str->Length = uVar9;
    }
  }
  uVar7 = Radix;
  if (uVar9 == 0) {
    return true;
  }
LAB_00da1fa7:
  pbVar10 = (byte *)Str->Data;
  *Result = 0;
  uVar6 = 0;
  uVar11 = uVar9;
  do {
    bVar1 = *pbVar10;
    if ((char)bVar1 < 0x30) goto LAB_00da2019;
    iVar3 = -0x30;
    if (0x39 < bVar1) {
      if (bVar1 < 0x61) {
        iVar3 = -0x37;
        if (0x19 < (byte)(bVar1 + 0xbf)) goto LAB_00da2019;
      }
      else {
        iVar3 = -0x57;
        if (0x7a < bVar1) goto LAB_00da2019;
      }
    }
    uVar4 = iVar3 + (char)bVar1;
    if (uVar7 <= uVar4) goto LAB_00da2019;
    uVar8 = (ulong)uVar4 + uVar6 * uVar7;
    *Result = uVar8;
    if (uVar8 / uVar7 < uVar6) {
      return true;
    }
    pbVar10 = pbVar10 + 1;
    uVar11 = uVar11 - 1;
    uVar6 = uVar8;
  } while (uVar11 != 0);
  uVar11 = 0;
LAB_00da2019:
  if (uVar9 != uVar11) {
    Str->Data = (char *)pbVar10;
    Str->Length = uVar11;
  }
  return uVar9 == uVar11;
}

Assistant:

bool llvm::consumeUnsignedInteger(StringRef &Str, unsigned Radix,
                                  unsigned long long &Result) {
  // Autosense radix if not specified.
  if (Radix == 0)
    Radix = GetAutoSenseRadix(Str);

  // Empty strings (after the radix autosense) are invalid.
  if (Str.empty()) return true;

  // Parse all the bytes of the string given this radix.  Watch for overflow.
  StringRef Str2 = Str;
  Result = 0;
  while (!Str2.empty()) {
    unsigned CharVal;
    if (Str2[0] >= '0' && Str2[0] <= '9')
      CharVal = Str2[0] - '0';
    else if (Str2[0] >= 'a' && Str2[0] <= 'z')
      CharVal = Str2[0] - 'a' + 10;
    else if (Str2[0] >= 'A' && Str2[0] <= 'Z')
      CharVal = Str2[0] - 'A' + 10;
    else
      break;

    // If the parsed value is larger than the integer radix, we cannot
    // consume any more characters.
    if (CharVal >= Radix)
      break;

    // Add in this character.
    unsigned long long PrevResult = Result;
    Result = Result * Radix + CharVal;

    // Check for overflow by shifting back and seeing if bits were lost.
    if (Result / Radix < PrevResult)
      return true;

    Str2 = Str2.substr(1);
  }

  // We consider the operation a failure if no characters were consumed
  // successfully.
  if (Str.size() == Str2.size())
    return true;

  Str = Str2;
  return false;
}